

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgFunctionGenerator.hpp
# Opt level: O2

void __thiscall
rsg::FunctionGenerator::requireAssignment(FunctionGenerator *this,Variable *variable)

{
  Variable *local_8;
  
  local_8 = variable;
  std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::push_back
            (&this->m_requiredAssignments,&local_8);
  return;
}

Assistant:

void					requireAssignment			(Variable* variable) { m_requiredAssignments.push_back(variable); }